

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssl_shim.cc
# Opt level: O2

bool CheckHandshakeProperties(SSL *ssl,bool is_resume,TestConfig *config)

{
  ushort uVar1;
  pointer puVar2;
  Span<const_unsigned_char> lhs;
  Span<const_unsigned_char> lhs_00;
  bool bVar3;
  bool bVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  uint uVar7;
  int iVar8;
  ssl_early_data_reason_t reason;
  int32_t iVar9;
  TestState *pTVar10;
  SSL_CIPHER *pSVar11;
  char *pcVar12;
  size_t sVar13;
  stack_st_X509 *psVar14;
  char cVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  FILE *pFVar19;
  Span<const_unsigned_char> lhs_01;
  Span<const_unsigned_char> lhs_02;
  Span<const_unsigned_char> lhs_03;
  Span<const_unsigned_char> rhs;
  Span<const_unsigned_char> rhs_00;
  Span<const_unsigned_char> rhs_01;
  Span<const_unsigned_char> rhs_02;
  Span<const_unsigned_char> rhs_03;
  size_t sStack_e0;
  size_t peer_params_len;
  size_t peer_settings_len;
  uint8_t *peer_settings;
  uint alpn_proto_len;
  string expect_settings;
  uint8_t *alpn_proto;
  uint8_t *next_proto;
  
  pTVar10 = GetTestState(ssl);
  bVar3 = CheckAuthProperties(ssl,is_resume,config);
  if (!bVar3) {
    return false;
  }
  pSVar11 = SSL_get_current_cipher((SSL *)ssl);
  if (pSVar11 == (SSL_CIPHER *)0x0) {
    pcVar12 = "null cipher after handshake\n";
    sStack_e0 = 0x1c;
    goto LAB_001202a0;
  }
  if (config->expect_version != 0) {
    uVar7 = SSL_version((SSL *)ssl);
    pFVar19 = _stderr;
    uVar1 = config->expect_version;
    if (uVar7 != uVar1) {
      uVar7 = SSL_version((SSL *)ssl);
      fprintf(pFVar19,"want version %04x, got %04x\n",(ulong)(uint)uVar1,(ulong)(uVar7 & 0xffff));
      return false;
    }
  }
  bVar3 = false;
  if (is_resume) {
    if (config->expect_session_miss == true) {
      iVar8 = SSL_in_early_data(ssl);
      bVar3 = iVar8 != 0;
    }
    else {
      bVar3 = true;
    }
  }
  iVar8 = SSL_session_reused(ssl);
  pFVar19 = _stderr;
  if (bVar3 != (iVar8 != 0)) {
    iVar8 = SSL_session_reused(ssl);
    pcVar12 = "";
    if (iVar8 == 0) {
      pcVar12 = " not";
    }
    pcVar18 = "session unexpectedly was%s reused\n";
    goto LAB_001204b1;
  }
  if ((is_resume) || (config->false_start == false)) {
    iVar8 = SSL_in_early_data(ssl);
    bVar3 = iVar8 == 0;
    cVar15 = pTVar10->handshake_done;
    if ((bool)cVar15 == bVar3) {
      if ((iVar8 == 0) && (config->is_server == false)) {
        bVar4 = false;
        if ((config->expect_no_session == false) &&
           ((iVar8 = SSL_session_reused(ssl), iVar8 == 0 || (config->expect_ticket_renewal == true))
           )) {
          uVar6 = GetProtocolVersion(ssl);
          bVar4 = uVar6 < 0x304;
        }
        if (bVar4 != pTVar10->got_new_session) {
          pcVar12 = " not";
          if (pTVar10->got_new_session != false) {
            pcVar12 = "";
          }
          pcVar18 = "new session was%s cached, but we expected the opposite\n";
          pFVar19 = _stderr;
          goto LAB_001204b1;
        }
      }
      if (!is_resume) goto LAB_0011faf7;
      goto LAB_0011fb1f;
    }
  }
  else {
    if (pTVar10->handshake_done == false) {
      bVar3 = false;
LAB_0011faf7:
      if ((config->expect_session_id == true) && (pTVar10->got_new_session == false)) {
        pcVar12 = "session was not cached on the server.\n";
        sStack_e0 = 0x26;
        goto LAB_001202a0;
      }
      if ((config->expect_no_session_id == true) && (pTVar10->got_new_session == true)) {
        pcVar12 = "session was unexpectedly cached on the server.\n";
        sStack_e0 = 0x2f;
        goto LAB_001202a0;
      }
LAB_0011fb1f:
      if (((config->handoff == false) && (config->is_server == true)) &&
         (pTVar10->early_callback_called == false)) {
        pcVar12 = "early callback not called\n";
        sStack_e0 = 0x1a;
        goto LAB_001202a0;
      }
      if ((config->expect_server_name)._M_string_length != 0) {
        pcVar12 = SSL_get_servername((SSL *)ssl,0);
        if ((pcVar12 == (char *)0x0) ||
           (bVar4 = std::operator!=(pcVar12,&config->expect_server_name), bVar4)) {
          fprintf(_stderr,"servername mismatch (got %s; want %s)\n",pcVar12,
                  (config->expect_server_name)._M_dataplus._M_p);
          return false;
        }
      }
      if (((config->expect_next_proto)._M_string_length == 0) &&
         (config->expect_no_next_proto != true)) {
LAB_0011fbc3:
        bVar4 = config->is_server;
        SSL_get0_alpn_selected(ssl,&alpn_proto,&alpn_proto_len);
        lhs_01.size_ = (&config->expect_alpn)[(ulong)bVar4 * 2]._M_string_length;
        lhs_01.data_ = (uchar *)(&config->expect_alpn)[(ulong)bVar4 * 2]._M_dataplus._M_p;
        rhs_00.size_._0_4_ = alpn_proto_len;
        rhs_00.data_ = alpn_proto;
        rhs_00.size_._4_4_ = 0;
        bVar4 = bssl::internal::operator!=(lhs_01,rhs_00);
        if (!bVar4) {
          uVar7 = SSL_has_application_settings(ssl);
          pFVar19 = _stderr;
          bVar4 = (config->expect_peer_application_settings).
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_engaged;
          if (uVar7 != bVar4) {
            iVar8 = SSL_has_application_settings(ssl);
            pcVar12 = "has";
            if (iVar8 == 0) {
              pcVar12 = "does not have";
            }
            pcVar18 = "connection %s application settings, but expected the opposite\n";
            goto LAB_001204b1;
          }
          if (bVar4 == false) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&expect_settings,"",(allocator<char> *)&next_proto);
          }
          else {
            std::__cxx11::string::string
                      ((string *)&expect_settings,
                       (string *)&config->expect_peer_application_settings);
          }
          SSL_get0_peer_application_settings(ssl,&peer_settings,&peer_settings_len);
          lhs_00._4_12_ = expect_settings._4_12_;
          lhs_00.data_._0_4_ = expect_settings._M_dataplus._M_p._0_4_;
          rhs_01.size_ = peer_settings_len;
          rhs_01.data_ = peer_settings;
          bVar4 = bssl::internal::operator!=(lhs_00,rhs_01);
          if (bVar4) {
            pcVar12 = "peer application settings mismatch\n";
            sStack_e0 = 0x23;
LAB_001205b4:
            fwrite(pcVar12,sStack_e0,1,_stderr);
          }
          else {
            if (bVar3 && (config->expect_quic_transport_params).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start !=
                         (config->expect_quic_transport_params).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish) {
              SSL_get_peer_quic_transport_params(ssl,&next_proto,&peer_params_len);
              puVar2 = (config->expect_quic_transport_params).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lhs_02.size_ = (long)(config->expect_quic_transport_params).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
              lhs_02.data_ = puVar2;
              rhs_02.size_ = peer_params_len;
              rhs_02.data_ = next_proto;
              bVar3 = bssl::internal::operator!=(lhs_02,rhs_02);
              if (bVar3) {
                pcVar12 = "QUIC transport params mismatch\n";
                sStack_e0 = 0x1f;
                goto LAB_001205b4;
              }
            }
            if ((config->expect_channel_id).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (config->expect_channel_id).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              sVar13 = SSL_get_tls_channel_id(ssl,(uint8_t *)&next_proto,0x40);
              if (sVar13 == 0) {
                pcVar12 = "no channel id negotiated\n";
                sStack_e0 = 0x19;
              }
              else {
                puVar2 = (config->expect_channel_id).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                lhs_03.size_ = (long)(config->expect_channel_id).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
                lhs_03.data_ = puVar2;
                rhs_03.size_ = 0x40;
                rhs_03.data_ = (uchar *)&next_proto;
                bVar3 = bssl::internal::operator!=(lhs_03,rhs_03);
                if (!bVar3) goto LAB_0011fd28;
                pcVar12 = "channel id mismatch\n";
                sStack_e0 = 0x14;
              }
              goto LAB_001205b4;
            }
LAB_0011fd28:
            if ((config->expect_extended_master_secret == true) &&
               (iVar8 = SSL_get_extms_support(ssl), iVar8 == 0)) {
              pcVar12 = "No EMS for connection when expected\n";
              sStack_e0 = 0x24;
              goto LAB_001205b4;
            }
            if ((config->expect_secure_renegotiation == true) &&
               (iVar8 = SSL_get_secure_renegotiation_support(ssl), iVar8 == 0)) {
              pcVar12 = "No secure renegotiation for connection when expected\n";
              sStack_e0 = 0x35;
              goto LAB_001205b4;
            }
            if ((config->expect_no_secure_renegotiation == true) &&
               (iVar8 = SSL_get_secure_renegotiation_support(ssl), iVar8 != 0)) {
              pcVar12 = "Secure renegotiation unexpectedly negotiated for connection\n";
              sStack_e0 = 0x3c;
              goto LAB_001205b4;
            }
            uVar6 = config->expect_peer_signature_algorithm;
            if ((uVar6 != 0) &&
               (uVar5 = SSL_get_peer_signature_algorithm(ssl), pFVar19 = _stderr, uVar6 != uVar5)) {
              uVar6 = SSL_get_peer_signature_algorithm(ssl);
              uVar17 = (ulong)uVar6;
              uVar16 = (ulong)config->expect_peer_signature_algorithm;
              pcVar12 = "Peer signature algorithm was %04x, wanted %04x.\n";
LAB_00120566:
              bVar3 = false;
              fprintf(pFVar19,pcVar12,uVar17,uVar16);
              goto LAB_001205bf;
            }
            if (config->expect_curve_id != 0) {
              uVar6 = SSL_get_curve_id(ssl);
              uVar16 = (ulong)config->expect_curve_id;
              if (config->expect_curve_id != uVar6) {
                uVar17 = (ulong)uVar6;
                pcVar12 = "curve_id was %04x, wanted %04x\n";
                pFVar19 = _stderr;
                goto LAB_00120566;
              }
            }
            pSVar11 = SSL_get_current_cipher((SSL *)ssl);
            uVar6 = SSL_CIPHER_get_protocol_id((SSL_CIPHER *)pSVar11);
            if (((config->expect_cipher_aes != 0) && (iVar8 = EVP_has_aes_hardware(), iVar8 != 0))
               && (uVar16 = (ulong)config->expect_cipher_aes, config->expect_cipher_aes != uVar6)) {
              uVar17 = (ulong)uVar6;
              pcVar12 = "Cipher ID was %04x, wanted %04x (has AES hardware)\n";
              pFVar19 = _stderr;
              goto LAB_00120566;
            }
            if (((config->expect_cipher_no_aes != 0) && (iVar8 = EVP_has_aes_hardware(), iVar8 == 0)
                ) && (uVar16 = (ulong)config->expect_cipher_no_aes,
                     config->expect_cipher_no_aes != uVar6)) {
              uVar17 = (ulong)uVar6;
              pcVar12 = "Cipher ID was %04x, wanted %04x (no AES hardware)\n";
              pFVar19 = _stderr;
              goto LAB_00120566;
            }
            uVar1 = config->expect_cipher;
            if (uVar1 != uVar6 && uVar1 != 0) {
              uVar16 = (ulong)uVar1;
              uVar17 = (ulong)uVar6;
              pcVar12 = "Cipher ID was %04x, wanted %04x\n";
              pFVar19 = _stderr;
              goto LAB_00120566;
            }
            iVar8 = SSL_in_early_data(ssl);
            if ((iVar8 == 0) && (iVar8 = SSL_is_dtls(ssl), iVar8 == 0)) {
              if (((config->expect_accept_early_data != true) ||
                  (iVar8 = SSL_early_data_accepted(ssl), iVar8 != 0)) &&
                 ((config->expect_reject_early_data != true ||
                  (iVar8 = SSL_early_data_accepted(ssl), iVar8 == 0)))) {
                reason = SSL_get_early_data_reason(ssl);
                pcVar12 = SSL_early_data_reason_string(reason);
                if ((config->expect_early_data_reason)._M_string_length != 0) {
                  bVar3 = std::operator!=(&config->expect_early_data_reason,pcVar12);
                  if (bVar3) {
                    bVar3 = false;
                    fprintf(_stderr,"Early data reason was \"%s\", expected \"%s\"\n",pcVar12,
                            (config->expect_early_data_reason)._M_dataplus._M_p);
                    goto LAB_001205bf;
                  }
                }
                goto LAB_0011feb8;
              }
              pFVar19 = _stderr;
              iVar8 = SSL_early_data_accepted(ssl);
              pcVar12 = "";
              if (iVar8 == 0) {
                pcVar12 = " not";
              }
              pcVar18 = "Early data was%s accepted, but we expected the opposite\n";
              goto LAB_00120388;
            }
LAB_0011feb8:
            iVar8 = SSL_is_dtls(ssl);
            if ((iVar8 != 0) && (iVar8 = SSL_in_early_data(ssl), iVar8 != 0)) {
              pcVar12 = "DTLS unexpectedly in early data\n";
              sStack_e0 = 0x20;
              goto LAB_001205b4;
            }
            if ((config->psk)._M_string_length != 0) {
              psVar14 = SSL_get_peer_cert_chain((SSL *)ssl);
              if (psVar14 == (stack_st_X509 *)0x0) goto LAB_0011ff54;
              pcVar12 = "Received peer certificate on a PSK cipher.\n";
              sStack_e0 = 0x2b;
              goto LAB_001205b4;
            }
            bVar3 = IsPAKE(ssl);
            if (bVar3) {
              psVar14 = SSL_get_peer_cert_chain((SSL *)ssl);
              if (psVar14 != (stack_st_X509 *)0x0) {
                pcVar12 = "Received peer certificate on a PAKE handshake.\n";
LAB_001205b2:
                sStack_e0 = 0x2f;
                goto LAB_001205b4;
              }
            }
            else if (((config->is_server != true) ||
                     (config->require_any_client_certificate == true)) &&
                    (psVar14 = SSL_get_peer_cert_chain((SSL *)ssl), psVar14 == (stack_st_X509 *)0x0)
                    ) {
              pcVar12 = "Received no peer certificate but expected one.\n";
              goto LAB_001205b2;
            }
LAB_0011ff54:
            if (((is_resume) && (config->expect_ticket_age_skew != 0)) &&
               (iVar9 = SSL_get_ticket_age_skew(ssl), pFVar19 = _stderr,
               iVar9 != config->expect_ticket_age_skew)) {
              uVar7 = SSL_get_ticket_age_skew(ssl);
              uVar16 = (ulong)(uint)config->expect_ticket_age_skew;
              pcVar12 = "Ticket age skew was %d, wanted %d\n";
              uVar17 = (ulong)uVar7;
              goto LAB_00120566;
            }
            if ((config->expect_selected_credential).super__Optional_base<int,_true,_true>.
                _M_payload.super__Optional_payload_base<int>._M_engaged == true) {
              uVar7 = (config->expect_selected_credential).super__Optional_base<int,_true,_true>.
                      _M_payload.super__Optional_payload_base<int>._M_payload._M_value;
              uVar16 = (ulong)uVar7;
              uVar17 = (ulong)(uint)pTVar10->selected_credential;
              if (uVar7 != pTVar10->selected_credential) {
                pcVar12 = "Credential %d was used, wanted %d\n";
                pFVar19 = _stderr;
                goto LAB_00120566;
              }
            }
            if (((config->expect_hrr == true) &&
                (iVar8 = SSL_used_hello_retry_request(ssl), iVar8 == 0)) ||
               ((config->expect_no_hrr == true &&
                (iVar8 = SSL_used_hello_retry_request(ssl), iVar8 != 0)))) {
              pFVar19 = _stderr;
              iVar8 = SSL_used_hello_retry_request(ssl);
              pcVar12 = "";
              if (iVar8 == 0) {
                pcVar12 = "no ";
              }
              pcVar18 = "Got %sHRR, but wanted opposite.\n";
LAB_00120388:
              bVar3 = false;
              fprintf(pFVar19,pcVar18,pcVar12);
              goto LAB_001205bf;
            }
            bVar3 = config->expect_ech_accept;
            iVar8 = SSL_ech_accepted(ssl);
            pFVar19 = _stderr;
            if (bVar3 != (iVar8 != 0)) {
              iVar8 = SSL_ech_accepted(ssl);
              pcVar12 = "";
              if (iVar8 == 0) {
                pcVar12 = "not ";
              }
              pcVar18 = "ECH was %saccepted, but wanted opposite.\n";
              goto LAB_00120388;
            }
            bVar3 = config->expect_key_usage_invalid;
            iVar8 = SSL_was_key_usage_invalid(ssl);
            pFVar19 = _stderr;
            if (bVar3 != (iVar8 != 0)) {
              iVar8 = SSL_was_key_usage_invalid(ssl);
              pcVar12 = "in";
              if (iVar8 == 0) {
                pcVar12 = "";
              }
              pcVar18 = "X.509 key usage was %svalid, but wanted opposite.\n";
              goto LAB_00120388;
            }
            pcVar12 = SSL_get_version((SSL *)ssl);
            bVar3 = CheckListContains("version",SSL_get_all_version_names,pcVar12);
            if (bVar3) {
              pSVar11 = SSL_get_current_cipher((SSL *)ssl);
              pcVar12 = SSL_CIPHER_standard_name((SSL_CIPHER *)pSVar11);
              bVar3 = CheckListContains("cipher",SSL_get_all_standard_cipher_names,pcVar12);
              if (bVar3) {
                pSVar11 = SSL_get_current_cipher((SSL *)ssl);
                pcVar12 = SSL_CIPHER_get_name(pSVar11);
                bVar3 = CheckListContains("OpenSSL cipher name",SSL_get_all_cipher_names,pcVar12);
                if (bVar3) {
                  uVar6 = SSL_get_group_id(ssl);
                  if (uVar6 != 0) {
                    uVar6 = SSL_get_group_id(ssl);
                    pcVar12 = SSL_get_group_name(uVar6);
                    bVar3 = CheckListContains("group",SSL_get_all_group_names,pcVar12);
                    if (!bVar3) goto LAB_001205bd;
                  }
                  uVar6 = SSL_get_peer_signature_algorithm(ssl);
                  if (uVar6 != 0) {
                    uVar6 = SSL_get_peer_signature_algorithm(ssl);
                    pcVar12 = SSL_get_signature_algorithm_name(uVar6,0);
                    bVar3 = CheckListContains("sigalg",SSL_get_all_signature_algorithm_names,pcVar12
                                             );
                    if (!bVar3) goto LAB_001205bd;
                  }
                  uVar6 = SSL_get_peer_signature_algorithm(ssl);
                  if (uVar6 != 0) {
                    uVar6 = SSL_get_peer_signature_algorithm(ssl);
                    pcVar12 = SSL_get_signature_algorithm_name(uVar6,1);
                    bVar3 = CheckListContains("sigalg with curve",
                                              SSL_get_all_signature_algorithm_names,pcVar12);
                    if (!bVar3) goto LAB_001205bd;
                  }
                  bVar3 = true;
                  if ((config->handshake_hints != true) || (config->allow_hint_mismatch != false))
                  goto LAB_001205bf;
                  iVar8 = SSL_version((SSL *)ssl);
                  if (iVar8 == 0x304) {
                    iVar8 = SSL_used_hello_retry_request(ssl);
                    if (iVar8 == 0) {
LAB_00120617:
                      if (pTVar10->used_private_key == true) {
                        pcVar12 = 
                        "Performed private key operation, but hint should have skipped it\n";
                        sStack_e0 = 0x41;
                        goto LAB_001205b4;
                      }
                    }
                  }
                  else {
                    pSVar11 = SSL_get_current_cipher((SSL *)ssl);
                    iVar8 = SSL_CIPHER_get_kx_nid((SSL_CIPHER *)pSVar11);
                    if (iVar8 != 0x3b7) goto LAB_00120617;
                  }
                  if (pTVar10->ticket_decrypt_done != true) goto LAB_001205bf;
                  pcVar12 = "Performed ticket decryption, but hint should have skipped it\n";
                  sStack_e0 = 0x3d;
                  goto LAB_001205b4;
                }
              }
            }
          }
LAB_001205bd:
          bVar3 = false;
LAB_001205bf:
          std::__cxx11::string::~string((string *)&expect_settings);
          return bVar3;
        }
        pcVar12 = "negotiated alpn proto mismatch\n";
      }
      else {
        SSL_get0_next_proto_negotiated((SSL *)ssl,&next_proto,(uint *)&expect_settings);
        lhs.data_ = *(uchar **)&(config->expect_next_proto)._M_dataplus;
        lhs.size_ = (config->expect_next_proto)._M_string_length;
        rhs.size_._0_4_ = expect_settings._M_dataplus._M_p._0_4_;
        rhs.data_ = next_proto;
        rhs.size_._4_4_ = 0;
        bVar4 = bssl::internal::operator!=(lhs,rhs);
        if (!bVar4) goto LAB_0011fbc3;
        pcVar12 = "negotiated next proto mismatch\n";
      }
      sStack_e0 = 0x1f;
LAB_001202a0:
      fwrite(pcVar12,sStack_e0,1,_stderr);
      return false;
    }
    cVar15 = '\x01';
  }
  pcVar12 = " not";
  if (cVar15 != '\0') {
    pcVar12 = "";
  }
  pcVar18 = "handshake was%s completed\n";
  pFVar19 = _stderr;
LAB_001204b1:
  fprintf(pFVar19,pcVar18,pcVar12);
  return false;
}

Assistant:

static bool CheckHandshakeProperties(SSL *ssl, bool is_resume,
                                     const TestConfig *config) {
  TestState *state = GetTestState(ssl);
  if (!CheckAuthProperties(ssl, is_resume, config)) {
    return false;
  }

  if (SSL_get_current_cipher(ssl) == nullptr) {
    fprintf(stderr, "null cipher after handshake\n");
    return false;
  }

  if (config->expect_version != 0 &&
      SSL_version(ssl) != int{config->expect_version}) {
    fprintf(stderr, "want version %04x, got %04x\n", config->expect_version,
            static_cast<uint16_t>(SSL_version(ssl)));
    return false;
  }

  bool expect_resume =
      is_resume && (!config->expect_session_miss || SSL_in_early_data(ssl));
  if (!!SSL_session_reused(ssl) != expect_resume) {
    fprintf(stderr, "session unexpectedly was%s reused\n",
            SSL_session_reused(ssl) ? "" : " not");
    return false;
  }

  bool expect_handshake_done =
      (is_resume || !config->false_start) && !SSL_in_early_data(ssl);
  if (expect_handshake_done != state->handshake_done) {
    fprintf(stderr, "handshake was%s completed\n",
            state->handshake_done ? "" : " not");
    return false;
  }

  if (expect_handshake_done && !config->is_server) {
    bool expect_new_session =
        !config->expect_no_session &&
        (!SSL_session_reused(ssl) || config->expect_ticket_renewal) &&
        // Session tickets are sent post-handshake in TLS 1.3.
        GetProtocolVersion(ssl) < TLS1_3_VERSION;
    if (expect_new_session != state->got_new_session) {
      fprintf(stderr,
              "new session was%s cached, but we expected the opposite\n",
              state->got_new_session ? "" : " not");
      return false;
    }
  }

  if (!is_resume) {
    if (config->expect_session_id && !state->got_new_session) {
      fprintf(stderr, "session was not cached on the server.\n");
      return false;
    }
    if (config->expect_no_session_id && state->got_new_session) {
      fprintf(stderr, "session was unexpectedly cached on the server.\n");
      return false;
    }
  }

  // early_callback_called is updated in the handshaker, so we don't see it
  // here.
  if (!config->handoff && config->is_server && !state->early_callback_called) {
    fprintf(stderr, "early callback not called\n");
    return false;
  }

  if (!config->expect_server_name.empty()) {
    const char *server_name =
        SSL_get_servername(ssl, TLSEXT_NAMETYPE_host_name);
    if (server_name == nullptr || server_name != config->expect_server_name) {
      fprintf(stderr, "servername mismatch (got %s; want %s)\n", server_name,
              config->expect_server_name.c_str());
      return false;
    }
  }

  if (!config->expect_next_proto.empty() || config->expect_no_next_proto) {
    const uint8_t *next_proto;
    unsigned next_proto_len;
    SSL_get0_next_proto_negotiated(ssl, &next_proto, &next_proto_len);
    if (bssl::StringAsBytes(config->expect_next_proto) !=
        bssl::Span(next_proto, next_proto_len)) {
      fprintf(stderr, "negotiated next proto mismatch\n");
      return false;
    }
  }

  // On the server, the protocol selected in the ALPN callback must be echoed
  // out of |SSL_get0_alpn_selected|. On the client, it should report what the
  // test expected.
  const std::string &expect_alpn =
      config->is_server ? config->select_alpn : config->expect_alpn;
  const uint8_t *alpn_proto;
  unsigned alpn_proto_len;
  SSL_get0_alpn_selected(ssl, &alpn_proto, &alpn_proto_len);
  if (bssl::StringAsBytes(expect_alpn) !=
      bssl::Span(alpn_proto, alpn_proto_len)) {
    fprintf(stderr, "negotiated alpn proto mismatch\n");
    return false;
  }

  if (SSL_has_application_settings(ssl) !=
      (config->expect_peer_application_settings ? 1 : 0)) {
    fprintf(stderr,
            "connection %s application settings, but expected the opposite\n",
            SSL_has_application_settings(ssl) ? "has" : "does not have");
    return false;
  }
  std::string expect_settings = config->expect_peer_application_settings
                                    ? *config->expect_peer_application_settings
                                    : "";
  const uint8_t *peer_settings;
  size_t peer_settings_len;
  SSL_get0_peer_application_settings(ssl, &peer_settings, &peer_settings_len);
  if (bssl::StringAsBytes(expect_settings) !=
      bssl::Span(peer_settings, peer_settings_len)) {
    fprintf(stderr, "peer application settings mismatch\n");
    return false;
  }

  if (!config->expect_quic_transport_params.empty() && expect_handshake_done) {
    const uint8_t *peer_params;
    size_t peer_params_len;
    SSL_get_peer_quic_transport_params(ssl, &peer_params, &peer_params_len);
    if (bssl::Span(config->expect_quic_transport_params) !=
        bssl::Span(peer_params, peer_params_len)) {
      fprintf(stderr, "QUIC transport params mismatch\n");
      return false;
    }
  }

  if (!config->expect_channel_id.empty()) {
    uint8_t channel_id[64];
    if (!SSL_get_tls_channel_id(ssl, channel_id, sizeof(channel_id))) {
      fprintf(stderr, "no channel id negotiated\n");
      return false;
    }
    if (bssl::Span(config->expect_channel_id) != channel_id) {
      fprintf(stderr, "channel id mismatch\n");
      return false;
    }
  }

  if (config->expect_extended_master_secret && !SSL_get_extms_support(ssl)) {
    fprintf(stderr, "No EMS for connection when expected\n");
    return false;
  }

  if (config->expect_secure_renegotiation &&
      !SSL_get_secure_renegotiation_support(ssl)) {
    fprintf(stderr, "No secure renegotiation for connection when expected\n");
    return false;
  }

  if (config->expect_no_secure_renegotiation &&
      SSL_get_secure_renegotiation_support(ssl)) {
    fprintf(stderr,
            "Secure renegotiation unexpectedly negotiated for connection\n");
    return false;
  }

  if (config->expect_peer_signature_algorithm != 0 &&
      config->expect_peer_signature_algorithm !=
          SSL_get_peer_signature_algorithm(ssl)) {
    fprintf(stderr, "Peer signature algorithm was %04x, wanted %04x.\n",
            SSL_get_peer_signature_algorithm(ssl),
            config->expect_peer_signature_algorithm);
    return false;
  }

  if (config->expect_curve_id != 0) {
    uint16_t curve_id = SSL_get_curve_id(ssl);
    if (config->expect_curve_id != curve_id) {
      fprintf(stderr, "curve_id was %04x, wanted %04x\n", curve_id,
              config->expect_curve_id);
      return false;
    }
  }

  uint16_t cipher_id = SSL_CIPHER_get_protocol_id(SSL_get_current_cipher(ssl));
  if (config->expect_cipher_aes != 0 && EVP_has_aes_hardware() &&
      config->expect_cipher_aes != cipher_id) {
    fprintf(stderr, "Cipher ID was %04x, wanted %04x (has AES hardware)\n",
            cipher_id, config->expect_cipher_aes);
    return false;
  }

  if (config->expect_cipher_no_aes != 0 && !EVP_has_aes_hardware() &&
      config->expect_cipher_no_aes != cipher_id) {
    fprintf(stderr, "Cipher ID was %04x, wanted %04x (no AES hardware)\n",
            cipher_id, config->expect_cipher_no_aes);
    return false;
  }

  if (config->expect_cipher != 0 && config->expect_cipher != cipher_id) {
    fprintf(stderr, "Cipher ID was %04x, wanted %04x\n", cipher_id,
            config->expect_cipher);
    return false;
  }

  // The early data status is only applicable after the handshake is confirmed.
  if (!SSL_in_early_data(ssl) && !SSL_is_dtls(ssl)) {
    if ((config->expect_accept_early_data && !SSL_early_data_accepted(ssl)) ||
        (config->expect_reject_early_data && SSL_early_data_accepted(ssl))) {
      fprintf(stderr,
              "Early data was%s accepted, but we expected the opposite\n",
              SSL_early_data_accepted(ssl) ? "" : " not");
      return false;
    }

    const char *early_data_reason =
        SSL_early_data_reason_string(SSL_get_early_data_reason(ssl));
    if (!config->expect_early_data_reason.empty() &&
        config->expect_early_data_reason != early_data_reason) {
      fprintf(stderr, "Early data reason was \"%s\", expected \"%s\"\n",
              early_data_reason, config->expect_early_data_reason.c_str());
      return false;
    }
  }

  if (SSL_is_dtls(ssl) && SSL_in_early_data(ssl)) {
    // TODO(crbug.com/381113363): Support early data for DTLS 1.3.
    fprintf(stderr, "DTLS unexpectedly in early data\n");
    return false;
  }

  if (!config->psk.empty()) {
    if (SSL_get_peer_cert_chain(ssl) != nullptr) {
      fprintf(stderr, "Received peer certificate on a PSK cipher.\n");
      return false;
    }
  } else if (IsPAKE(ssl)) {
    if (SSL_get_peer_cert_chain(ssl) != nullptr) {
      fprintf(stderr, "Received peer certificate on a PAKE handshake.\n");
      return false;
    }
  } else if (!config->is_server || config->require_any_client_certificate) {
    if (SSL_get_peer_cert_chain(ssl) == nullptr) {
      fprintf(stderr, "Received no peer certificate but expected one.\n");
      return false;
    }
  }

  if (is_resume && config->expect_ticket_age_skew != 0 &&
      SSL_get_ticket_age_skew(ssl) != config->expect_ticket_age_skew) {
    fprintf(stderr, "Ticket age skew was %" PRId32 ", wanted %d\n",
            SSL_get_ticket_age_skew(ssl), config->expect_ticket_age_skew);
    return false;
  }

  if (config->expect_selected_credential.has_value() &&
      *config->expect_selected_credential != state->selected_credential) {
    fprintf(stderr, "Credential %d was used, wanted %d\n",
            state->selected_credential, *config->expect_selected_credential);
    return false;
  }

  if ((config->expect_hrr && !SSL_used_hello_retry_request(ssl)) ||
      (config->expect_no_hrr && SSL_used_hello_retry_request(ssl))) {
    fprintf(stderr, "Got %sHRR, but wanted opposite.\n",
            SSL_used_hello_retry_request(ssl) ? "" : "no ");
    return false;
  }

  if (config->expect_ech_accept != !!SSL_ech_accepted(ssl)) {
    fprintf(stderr, "ECH was %saccepted, but wanted opposite.\n",
            SSL_ech_accepted(ssl) ? "" : "not ");
    return false;
  }

  if (config->expect_key_usage_invalid != !!SSL_was_key_usage_invalid(ssl)) {
    fprintf(stderr, "X.509 key usage was %svalid, but wanted opposite.\n",
            SSL_was_key_usage_invalid(ssl) ? "in" : "");
    return false;
  }

  // Check all the selected parameters are covered by the string APIs.
  if (!CheckListContains("version", SSL_get_all_version_names,
                         SSL_get_version(ssl)) ||
      !CheckListContains(
          "cipher", SSL_get_all_standard_cipher_names,
          SSL_CIPHER_standard_name(SSL_get_current_cipher(ssl))) ||
      !CheckListContains("OpenSSL cipher name", SSL_get_all_cipher_names,
                         SSL_CIPHER_get_name(SSL_get_current_cipher(ssl))) ||
      (SSL_get_group_id(ssl) != 0 &&
       !CheckListContains("group", SSL_get_all_group_names,
                          SSL_get_group_name(SSL_get_group_id(ssl)))) ||
      (SSL_get_peer_signature_algorithm(ssl) != 0 &&
       !CheckListContains(
           "sigalg", SSL_get_all_signature_algorithm_names,
           SSL_get_signature_algorithm_name(
               SSL_get_peer_signature_algorithm(ssl), /*include_curve=*/0))) ||
      (SSL_get_peer_signature_algorithm(ssl) != 0 &&
       !CheckListContains(
           "sigalg with curve", SSL_get_all_signature_algorithm_names,
           SSL_get_signature_algorithm_name(
               SSL_get_peer_signature_algorithm(ssl), /*include_curve=*/1)))) {
    return false;
  }

  // Test that handshake hints correctly skipped the expected operations.
  if (config->handshake_hints && !config->allow_hint_mismatch) {
    // If the private key operation is performed in the first roundtrip, a hint
    // match should have skipped it. This is ECDHE-based cipher suites in TLS
    // 1.2 and non-HRR handshakes in TLS 1.3.
    bool private_key_allowed;
    if (SSL_version(ssl) == TLS1_3_VERSION) {
      private_key_allowed = SSL_used_hello_retry_request(ssl);
    } else {
      private_key_allowed =
          SSL_CIPHER_get_kx_nid(SSL_get_current_cipher(ssl)) == NID_kx_rsa;
    }
    if (!private_key_allowed && state->used_private_key) {
      fprintf(
          stderr,
          "Performed private key operation, but hint should have skipped it\n");
      return false;
    }

    if (state->ticket_decrypt_done) {
      fprintf(stderr,
              "Performed ticket decryption, but hint should have skipped it\n");
      return false;
    }

    // TODO(davidben): Decide what we want to do with TLS 1.2 stateful
    // resumption.
  }
  return true;
}